

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O1

Family<prometheus::Histogram> * __thiscall
prometheus::Registry::Add<prometheus::Histogram>
          (Registry *this,string *name,string *help,Labels *labels)

{
  bool bVar1;
  int iVar2;
  Family<prometheus::Histogram> *in_RAX;
  __normal_iterator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_>_>_>
  _Var3;
  Labels *pLVar4;
  invalid_argument *piVar5;
  pointer *__ptr;
  _Head_base<0UL,_prometheus::Family<prometheus::Histogram>_*,_false> _Var6;
  unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>
  family;
  _Head_base<0UL,_prometheus::Family<prometheus::Histogram>_*,_false> local_38;
  
  local_38._M_head_impl = in_RAX;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar2 == 0) {
    bVar1 = NameExistsInOtherType<prometheus::Histogram>(this,name);
    if (!bVar1) {
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>*,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>>,__gnu_cxx::__ops::_Iter_pred<prometheus::Registry::Add<prometheus::Histogram>(std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>const&)_1_>>
                        ((this->histograms_).
                         super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->histograms_).
                         super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,name);
      if (_Var3._M_current ==
          (this->histograms_).
          super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        detail::
        make_unique<prometheus::Family<prometheus::Histogram>,std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
                  ((detail *)&local_38,name,help,labels);
        _Var6._M_head_impl = local_38._M_head_impl;
        std::
        vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>
        ::
        emplace_back<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>
                  ((vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>
                    *)&this->histograms_,
                   (unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>
                    *)&local_38);
        if (local_38._M_head_impl != (Family<prometheus::Histogram> *)0x0) {
          (*((local_38._M_head_impl)->super_Collectable)._vptr_Collectable[1])();
        }
LAB_0014a74e:
        pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
        return _Var6._M_head_impl;
      }
      if (this->insert_behavior_ == Merge) {
        pLVar4 = Family<prometheus::Histogram>::GetConstantLabels_abi_cxx11_
                           (((_Var3._M_current)->_M_t).
                            super___uniq_ptr_impl<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_prometheus::Family<prometheus::Histogram>_*,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>
                            .
                            super__Head_base<0UL,_prometheus::Family<prometheus::Histogram>_*,_false>
                            ._M_head_impl);
        if ((pLVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count ==
            (labels->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
          bVar1 = std::__equal<false>::
                  equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            ((pLVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                             (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )&(pLVar4->_M_t)._M_impl.super__Rb_tree_header,
                             (labels->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
          if (bVar1) {
            _Var6._M_head_impl =
                 ((_Var3._M_current)->_M_t).
                 super___uniq_ptr_impl<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_prometheus::Family<prometheus::Histogram>_*,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>
                 .super__Head_base<0UL,_prometheus::Family<prometheus::Histogram>_*,_false>.
                 _M_head_impl;
            goto LAB_0014a74e;
          }
        }
        piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar5,"Family name already exists with different constant labels");
      }
      else {
        piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar5,"Family name already exists");
      }
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    std::__throw_system_error(iVar2);
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar5,"Family name already exists with different type");
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Family<T>& Registry::Add(const std::string& name, const std::string& help,
                         const Labels& labels) {
  std::lock_guard<std::mutex> lock{mutex_};

  if (NameExistsInOtherType<T>(name)) {
    throw std::invalid_argument(
        "Family name already exists with different type");
  }

  auto& families = GetFamilies<T>();

  auto same_name = [&name](const std::unique_ptr<Family<T>>& family) {
    return name == family->GetName();
  };

  auto it = std::find_if(families.begin(), families.end(), same_name);
  if (it != families.end()) {
    if (insert_behavior_ == InsertBehavior::Merge) {
      if ((*it)->GetConstantLabels() == labels) {
        return **it;
      }
      throw std::invalid_argument(
          "Family name already exists with different constant labels");
    } else {
      throw std::invalid_argument("Family name already exists");
    }
  }

  auto family = detail::make_unique<Family<T>>(name, help, labels);
  auto& ref = *family;
  families.push_back(std::move(family));
  return ref;
}